

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O3

HTMLElement * __thiscall
soul::HTMLGenerator::createNav(HTMLElement *__return_storage_ptr__,HTMLGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  HTMLElement *this_00;
  string_view value;
  string_view value_00;
  char *local_88;
  size_type local_80;
  char local_78;
  undefined7 uStack_77;
  undefined8 uStack_70;
  TableOfContentsNode local_68;
  
  local_88 = &local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"nav","");
  paVar1 = &(__return_storage_ptr__->name).field_2;
  (__return_storage_ptr__->name)._M_dataplus._M_p = (pointer)paVar1;
  if (local_88 == &local_78) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_77,local_78);
    *(undefined8 *)((long)&(__return_storage_ptr__->name).field_2 + 8) = uStack_70;
  }
  else {
    (__return_storage_ptr__->name)._M_dataplus._M_p = local_88;
    (__return_storage_ptr__->name).field_2._M_allocated_capacity = CONCAT71(uStack_77,local_78);
  }
  (__return_storage_ptr__->name)._M_string_length = local_80;
  local_80 = 0;
  local_78 = '\0';
  __return_storage_ptr__->isContent = false;
  __return_storage_ptr__->contentIsInline = false;
  (__return_storage_ptr__->properties).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->properties).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->properties).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->children).
  super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->children).
  super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->children).
  super__Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  value._M_str = "contents";
  value._M_len = 8;
  local_88 = &local_78;
  this_00 = choc::html::HTMLElement::setID(__return_storage_ptr__,value);
  value_00._M_str = "contents";
  value_00._M_len = 8;
  choc::html::HTMLElement::setClass(this_00,value_00);
  SourceCodeModel::createTableOfContentsRoot(&local_68,&this->model);
  printTOCNode(this,__return_storage_ptr__,&local_68,true);
  std::
  vector<soul::SourceCodeModel::TableOfContentsNode,_std::allocator<soul::SourceCodeModel::TableOfContentsNode>_>
  ::~vector(&local_68.children);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.name._M_dataplus._M_p != &local_68.name.field_2) {
    operator_delete(local_68.name._M_dataplus._M_p,local_68.name.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

choc::html::HTMLElement createNav()
    {
        choc::html::HTMLElement nav ("nav");
        nav.setID ("contents").setClass ("contents");
        printTOCNode (nav, model.createTableOfContentsRoot(), true);
        return nav;
    }